

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O2

int logmath_add_exact(logmath_t *lmath,int logb_p,int logb_q)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = pow((double)lmath->base,(double)(logb_p << ((lmath->t).shift & 0x1fU)));
  dVar3 = pow((double)lmath->base,(double)(logb_q << ((lmath->t).shift & 0x1fU)));
  iVar1 = logmath_log(lmath,(float64)(dVar3 + dVar2));
  return iVar1;
}

Assistant:

int
logmath_add_exact(logmath_t *lmath, int logb_p, int logb_q)
{
    return logmath_log(lmath,
                       logmath_exp(lmath, logb_p)
                       + logmath_exp(lmath, logb_q));
}